

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.cpp
# Opt level: O3

Path * __thiscall Pathie::Path::operator[](Path *__return_storage_ptr__,Path *this,size_t index)

{
  string *psVar1;
  long lVar2;
  out_of_range *this_00;
  size_t sVar3;
  _Alloc_hider _Var4;
  bool bVar5;
  undefined1 *local_b0 [2];
  undefined1 local_a0 [16];
  string local_90;
  string local_70;
  string local_50;
  
  if ((index == 0) && (*(this->m_path)._M_dataplus._M_p == '/')) {
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"/","");
    Path(__return_storage_ptr__,&local_90);
    _Var4._M_p = local_90._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p == &local_90.field_2) {
      return __return_storage_ptr__;
    }
  }
  else {
    lVar2 = std::__cxx11::string::find((char *)this,0x10f1b8,0);
    sVar3 = 0;
    if (lVar2 == -1) {
LAB_0010bc35:
      if (sVar3 != index) {
        this_00 = (out_of_range *)__cxa_allocate_exception(0x10);
        local_b0[0] = local_a0;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_b0,"Index out of path range","");
        std::out_of_range::out_of_range(this_00,(string *)local_b0);
        __cxa_throw(this_00,&std::out_of_range::typeinfo,std::out_of_range::~out_of_range);
      }
      std::__cxx11::string::substr((ulong)&local_70,(ulong)this);
      Path(__return_storage_ptr__,&local_70);
      psVar1 = &local_70;
    }
    else {
      if (index != 0) {
        sVar3 = 1;
        do {
          lVar2 = std::__cxx11::string::find((char *)this,0x10f1b8,lVar2 + 1);
          if (lVar2 == -1) goto LAB_0010bc35;
          bVar5 = sVar3 != index;
          sVar3 = sVar3 + 1;
        } while (bVar5);
      }
      std::__cxx11::string::substr((ulong)&local_50,(ulong)this);
      Path(__return_storage_ptr__,&local_50);
      psVar1 = &local_50;
    }
    _Var4._M_p = *(pointer *)((psVar1->field_2)._M_local_buf + -0x10);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_Var4._M_p == &psVar1->field_2) {
      return __return_storage_ptr__;
    }
  }
  operator_delete(_Var4._M_p);
  return __return_storage_ptr__;
}

Assistant:

Path Path::operator[](size_t index) const
{
  // Absolute path index 0 needs special treatment
  if (index == 0 && m_path[0] == '/')
    return Path("/");

  size_t pos     = 0;
  size_t lastpos = 0;
  size_t i       = 0;
  while ((pos = m_path.find("/", pos)) != string::npos) { // Assignment intended
    if (i == index)
      return Path(m_path.substr(lastpos, pos - lastpos));

    lastpos = pos + 1;
    pos++;
    i++;
  }

  // Last element requested
  if (index == i)
    return Path(m_path.substr(lastpos));

  // Out of range
  throw(std::out_of_range("Index out of path range"));
}